

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

TestCaseGroup *
deqp::gles31::Functional::createChildCases
          (CaseType type,Context *ctx,char *name,char *desc,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
          *funcs)

{
  undefined4 uVar1;
  pointer pFVar2;
  char *name_00;
  char *desc_00;
  TestContext *pTVar3;
  TestNode *this;
  BaseCase *this_00;
  ulong uVar4;
  long lVar5;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,ctx->m_testCtx,name,desc);
  lVar5 = 0x18;
  for (uVar4 = 0;
      pFVar2 = (funcs->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(funcs->
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 5);
      uVar4 = uVar4 + 1) {
    name_00 = *(char **)((long)pFVar2 + lVar5 + -8);
    desc_00 = *(char **)((long)&(pFVar2->function).m_type + lVar5);
    uVar1 = *(undefined4 *)((long)pFVar2 + lVar5 + -0x18);
    pTVar3 = *(TestContext **)((long)pFVar2 + lVar5 + -0x10);
    if (type == CASETYPE_GETERROR) {
      this_00 = (BaseCase *)operator_new(0xd8);
      anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
      (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BaseCase_01e4db90;
      *(undefined4 *)
       &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           uVar1;
      this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    }
    else {
      if (type == CASETYPE_LOG) {
        this_00 = (BaseCase *)operator_new(0x108);
        anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
        (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__LogErrorCase_01e4db28;
        *(undefined4 *)
         &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             uVar1;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      }
      else {
        this_00 = (BaseCase *)operator_new(0x108);
        anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
        (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__CallbackErrorCase_01e4da58;
        *(undefined4 *)
         &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             uVar1;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      }
      this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
      _M_p = (pointer)0x0;
      this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
      _M_string_length = 0;
      this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
      _M_allocated_capacity =
           (size_type)
           &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_description;
      *(undefined8 *)
       ((long)&this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
               field_2 + 8) = 0;
      *(undefined1 *)
       &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_description.
        _M_dataplus._M_p = 0;
    }
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    lVar5 = lVar5 + 0x20;
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createChildCases (CaseType type, Context& ctx, const char* name, const char* desc, const vector<FunctionContainer>& funcs)
{
	tcu::TestCaseGroup* host = new tcu::TestCaseGroup(ctx.getTestContext(), name, desc);

	for (size_t ndx = 0; ndx < funcs.size(); ndx++)
			host->addChild(createCase(type, ctx, funcs[ndx].name, funcs[ndx].desc, funcs[ndx].function));

	return host;
}